

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

void __thiscall
compressed_distance_matrix<(compressed_matrix_layout)0>::
compressed_distance_matrix<compressed_distance_matrix<(compressed_matrix_layout)1>>
          (compressed_distance_matrix<(compressed_matrix_layout)0> *this,
          compressed_distance_matrix<(compressed_matrix_layout)1> *mat)

{
  pointer ppfVar1;
  pointer ppfVar2;
  pointer ppfVar3;
  float *pfVar4;
  long lVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  int iVar8;
  size_t j;
  ulong uVar9;
  int iVar10;
  float fVar11;
  allocator_type local_12;
  allocator_type local_11;
  
  lVar5 = (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  std::vector<float,_std::allocator<float>_>::vector
            (&this->distances,(ulong)((lVar5 + -1) * lVar5) >> 1,&local_11);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,
             (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_12);
  init_rows(this);
  ppfVar1 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppfVar2 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (uVar7 = 1; uVar7 < (ulong)((long)ppfVar2 - (long)ppfVar1 >> 3); uVar7 = uVar7 + 1) {
    ppfVar3 = (mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar4 = ppfVar1[uVar7];
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      fVar11 = 0.0;
      iVar6 = (int)uVar7;
      iVar8 = (int)uVar9;
      if (iVar6 != iVar8) {
        iVar10 = iVar8;
        if (iVar8 < iVar6) {
          iVar10 = iVar6;
        }
        if (iVar6 < iVar8) {
          iVar8 = iVar6;
        }
        fVar11 = ppfVar3[iVar8][iVar10];
      }
      pfVar4[uVar9] = fVar11;
    }
  }
  return;
}

Assistant:

compressed_distance_matrix(const DistanceMatrix& mat)
	    : distances(mat.size() * (mat.size() - 1) / 2), rows(mat.size()) {
		init_rows();

		for (size_t i = 1ul; i < size(); ++i)
			for (size_t j = 0ul; j < i; ++j) rows[i][j] = mat(index_t(i), index_t(j));
	}